

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3DbIsNamed(sqlite3 *db,int iDb,char *zName)

{
  int iVar1;
  bool local_22;
  bool local_21;
  char *zName_local;
  int iDb_local;
  sqlite3 *db_local;
  
  iVar1 = sqlite3StrICmp(db->aDb[iDb].zDbSName,zName);
  local_21 = true;
  if (iVar1 != 0) {
    local_22 = false;
    if (iDb == 0) {
      iVar1 = sqlite3StrICmp("main",zName);
      local_22 = iVar1 == 0;
    }
    local_21 = local_22;
  }
  return (int)local_21;
}

Assistant:

SQLITE_PRIVATE int sqlite3DbIsNamed(sqlite3 *db, int iDb, const char *zName){
  return (
      sqlite3StrICmp(db->aDb[iDb].zDbSName, zName)==0
   || (iDb==0 && sqlite3StrICmp("main", zName)==0)
  );
}